

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

string * __thiscall
cmGeneratorTarget::GetCompilePDBName
          (string *__return_storage_ptr__,cmGeneratorTarget *this,string *config)

{
  char *pcVar1;
  string prefix;
  string configProp;
  string configUpper;
  string suffix;
  string base;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string local_38;
  
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  local_38._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  local_38.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  GetFullNameInternal(this,config,RuntimeBinaryArtifact,&local_b8,&local_38,&local_58);
  cmsys::SystemTools::UpperCase(&local_78,config);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"COMPILE_PDB_NAME_",(allocator<char> *)&local_d8);
  std::__cxx11::string::append((string *)&local_98);
  pcVar1 = GetProperty(this,&local_98);
  if ((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"COMPILE_PDB_NAME",&local_d9);
    pcVar1 = GetProperty(this,&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    if ((pcVar1 == (char *)0x0) || (*pcVar1 == '\0')) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__,"",(allocator<char> *)&local_d8);
      goto LAB_0022ee4f;
    }
    std::operator+(&local_d8,&local_b8,pcVar1);
    std::operator+(__return_storage_ptr__,&local_d8,".pdb");
  }
  else {
    std::operator+(&local_d8,&local_b8,pcVar1);
    std::operator+(__return_storage_ptr__,&local_d8,".pdb");
  }
  std::__cxx11::string::~string((string *)&local_d8);
LAB_0022ee4f:
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_b8);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGeneratorTarget::GetCompilePDBName(
  const std::string& config) const
{
  std::string prefix;
  std::string base;
  std::string suffix;
  this->GetFullNameInternal(config, cmStateEnums::RuntimeBinaryArtifact,
                            prefix, base, suffix);

  // Check for a per-configuration output directory target property.
  std::string configUpper = cmSystemTools::UpperCase(config);
  std::string configProp = "COMPILE_PDB_NAME_";
  configProp += configUpper;
  const char* config_name = this->GetProperty(configProp);
  if (config_name && *config_name) {
    return prefix + config_name + ".pdb";
  }

  const char* name = this->GetProperty("COMPILE_PDB_NAME");
  if (name && *name) {
    return prefix + name + ".pdb";
  }

  return "";
}